

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int greatest_memory_printf_cb(void *t,void *udata)

{
  ulong uVar1;
  byte bVar2;
  FILE *__stream;
  int iVar3;
  ulong uVar4;
  ushort **ppuVar5;
  undefined8 uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  
  __stream = _stdout;
  iVar8 = 0;
  uVar1 = 0;
  while (uVar7 = uVar1, uVar9 = *(ulong *)((long)udata + 0x10) - uVar7,
        uVar7 <= *(ulong *)((long)udata + 0x10) && uVar9 != 0) {
    if (0xf < uVar9) {
      uVar9 = 0x10;
    }
    uVar1 = uVar9 + uVar7;
    uVar6 = 0x20;
    for (uVar4 = uVar7; uVar4 < uVar1; uVar4 = uVar4 + 1) {
      if (*(char *)(*udata + uVar4) != *(char *)(*(long *)((long)udata + 8) + uVar4)) {
        uVar6 = 0x58;
      }
    }
    iVar3 = fprintf(__stream,"\n%04x %c ",uVar7 & 0xffffffff,uVar6);
    iVar8 = iVar8 + iVar3;
    for (uVar4 = uVar7; uVar4 < uVar1; uVar4 = uVar4 + 1) {
      uVar6 = 0x20;
      if (*(char *)(*udata + uVar4) != *(char *)(*(long *)((long)udata + 8) + uVar4)) {
        uVar6 = 0x3c;
      }
      iVar3 = fprintf(__stream,"%02x%c",(ulong)*(byte *)((long)t + uVar4),uVar6);
      iVar8 = iVar8 + iVar3;
    }
    for (lVar10 = uVar9 - 0x10; lVar10 != 0; lVar10 = lVar10 + 1) {
      iVar3 = fprintf(__stream,"   ");
      iVar8 = iVar8 + iVar3;
    }
    fputc(0x20,__stream);
    for (; uVar7 < uVar1; uVar7 = uVar7 + 1) {
      bVar2 = *(byte *)((long)t + uVar7);
      ppuVar5 = __ctype_b_loc();
      uVar9 = 0x2e;
      if (((*ppuVar5)[bVar2] >> 0xe & 1) != 0) {
        uVar9 = (ulong)bVar2;
      }
      iVar3 = fprintf(__stream,"%c",uVar9);
      iVar8 = iVar8 + iVar3;
    }
  }
  iVar3 = fprintf(__stream,"\n");
  return iVar3 + iVar8;
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}